

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

ITexture * __thiscall
irr::video::COpenGL3DriverBase::addRenderTargetTexture
          (COpenGL3DriverBase *this,dimension2d<unsigned_int> *size,path *name,ECOLOR_FORMAT format)

{
  code *pcVar1;
  _func_int *p_Var2;
  uint uVar3;
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *this_00;
  
  uVar3 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x44])(this,0x10);
  (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x43])(this,0x10,0);
  this_00 = (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *)operator_new(0x108);
  COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::COpenGLCoreTexture
            (this_00,name,size,ETT_2D,format,this);
  CNullDriver::addTexture(&this->super_CNullDriver,(ITexture *)this_00);
  p_Var2 = (this_00->super_ITexture)._vptr_ITexture[-3];
  pcVar1 = p_Var2 + 8 + (long)&(this_00->super_ITexture).NamedPath.Path;
  *(int *)pcVar1 = *(int *)pcVar1 + -1;
  if (*(int *)pcVar1 == 0) {
    (**(code **)(*(long *)((long)&(this_00->super_ITexture)._vptr_ITexture + (long)p_Var2) + 8))();
  }
  (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x43])
            (this,0x10,(ulong)(uVar3 & 0xff));
  return &this_00->super_ITexture;
}

Assistant:

ITexture *COpenGL3DriverBase::addRenderTargetTexture(const core::dimension2d<u32> &size,
		const io::path &name, const ECOLOR_FORMAT format)
{
	// disable mip-mapping
	bool generateMipLevels = getTextureCreationFlag(ETCF_CREATE_MIP_MAPS);
	setTextureCreationFlag(ETCF_CREATE_MIP_MAPS, false);

	COpenGL3Texture *renderTargetTexture = new COpenGL3Texture(name, size, ETT_2D, format, this);
	addTexture(renderTargetTexture);
	renderTargetTexture->drop();

	// restore mip-mapping
	setTextureCreationFlag(ETCF_CREATE_MIP_MAPS, generateMipLevels);

	return renderTargetTexture;
}